

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt_limits.c
# Opt level: O0

void test_psbt_read(psbt_test *test,uchar *p,size_t plen)

{
  wally_psbt *pwVar1;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  wally_psbt *pwVar6;
  ulong local_38;
  size_t bit;
  wally_psbt *psbt;
  size_t i;
  size_t plen_local;
  uchar *p_local;
  psbt_test *test_local;
  
  i = plen;
  plen_local = (size_t)p;
  p_local = (uchar *)test;
  sVar4 = strlen(test->hex);
  sVar5 = hex_data_size(sVar4);
  if (i < sVar5) {
    __assert_fail("hex_data_size(strlen(test->hex)) <= plen",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/libwally-core/src/ctest/test_psbt_limits.c"
                  ,0x50,"void test_psbt_read(const struct psbt_test *, unsigned char *, size_t)");
  }
  psbt = (wally_psbt *)0x0;
  while( true ) {
    pwVar1 = psbt;
    sVar4 = strlen(*(char **)p_local);
    pwVar6 = (wally_psbt *)hex_data_size(sVar4);
    if (pwVar6 < pwVar1) {
      return;
    }
    _Var2 = hex_decode(*(char **)p_local,(long)psbt << 1,(void *)((plen_local + i) - (long)psbt),
                       (size_t)psbt);
    if (!_Var2) break;
    iVar3 = wally_psbt_from_bytes((plen_local + i) - (long)psbt,psbt,&bit);
    if (iVar3 == 0) {
      wally_psbt_free(bit);
    }
    for (local_38 = 0; local_38 < 8; local_38 = local_38 + 1) {
      *(byte *)(plen_local + (i - 1)) =
           *(byte *)(plen_local + (i - 1)) ^ (byte)(1 << ((byte)local_38 & 0x1f));
      iVar3 = wally_psbt_from_bytes((plen_local + i) - (long)psbt,psbt,&bit);
      if (iVar3 == 0) {
        wally_psbt_free(bit);
      }
      *(byte *)(plen_local + (i - 1)) =
           *(byte *)(plen_local + (i - 1)) ^ (byte)(1 << ((byte)local_38 & 0x1f));
    }
    psbt = (wally_psbt *)(psbt->magic + 1);
  }
  abort();
}

Assistant:

static void test_psbt_read(const struct psbt_test *test,
                           unsigned char *p, size_t plen)
{
    size_t i;

    /* It can fit, otherwise adjust cliff() */
    assert(hex_data_size(strlen(test->hex)) <= plen);

    /* Unpack right next to the cliff */
    for (i = 0; i <= hex_data_size(strlen(test->hex)); i++) {
        struct wally_psbt *psbt;
        size_t bit;

        if (!hex_decode(test->hex, i * 2, p + plen - i, i))
            abort();

        /* Try it raw: probably will fail. */
        if (wally_psbt_from_bytes(p + plen - i, i, &psbt) == WALLY_OK)
            wally_psbt_free(psbt);

        /* Now try flipping each bit in last byte. */
        for (bit = 0; bit < 8; bit++) {
            p[plen - 1] ^= (1 << bit);
            if (wally_psbt_from_bytes(p + plen - i, i, &psbt) == WALLY_OK)
                wally_psbt_free(psbt);
            p[plen - 1] ^= (1 << bit);
        }
    }
}